

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O3

void cnn::TensorTools::RandomBernoulli(Tensor *val,real p,real scale)

{
  float *pfVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ushort uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  double dVar20;
  int iVar21;
  
  uVar8 = (ulong)(val->d).nd;
  if (uVar8 == 0) {
    iVar21 = 1;
  }
  else {
    auVar14 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar17 = vpbroadcastq_avx512f();
    uVar9 = 0;
    do {
      auVar18 = vpbroadcastq_avx512f();
      auVar19 = vmovdqa64_avx512f(auVar14);
      auVar14 = vporq_avx512f(auVar18,auVar15);
      auVar18 = vporq_avx512f(auVar18,auVar16);
      uVar5 = vpcmpuq_avx512f(auVar18,auVar17,2);
      bVar6 = (byte)uVar5;
      uVar5 = vpcmpuq_avx512f(auVar14,auVar17,2);
      bVar7 = (byte)uVar5;
      uVar12 = CONCAT11(bVar7,bVar6);
      auVar14 = vmovdqu32_avx512f(*(undefined1 (*) [64])((val->d).d + uVar9));
      auVar18._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar14._4_4_;
      auVar18._0_4_ = (uint)(bVar6 & 1) * auVar14._0_4_;
      auVar18._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar14._8_4_;
      auVar18._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar14._12_4_;
      auVar18._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar14._16_4_;
      auVar18._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar14._20_4_;
      auVar18._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar14._24_4_;
      auVar18._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar14._28_4_;
      auVar18._32_4_ = (uint)(bVar7 & 1) * auVar14._32_4_;
      auVar18._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar14._36_4_;
      auVar18._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar14._40_4_;
      auVar18._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar14._44_4_;
      auVar18._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar14._48_4_;
      auVar18._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar14._52_4_;
      auVar18._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar14._56_4_;
      auVar18._60_4_ = (uint)(bVar7 >> 7) * auVar14._60_4_;
      uVar9 = uVar9 + 0x10;
      auVar14 = vpmulld_avx512f(auVar18,auVar19);
    } while ((uVar8 + 0xf & 0xfffffffffffffff0) != uVar9);
    auVar14 = vmovdqa32_avx512f(auVar14);
    auVar15._0_4_ = (uint)(bVar6 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar19._0_4_;
    bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
    auVar15._4_4_ = (uint)bVar2 * auVar14._4_4_ | (uint)!bVar2 * auVar19._4_4_;
    bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
    auVar15._8_4_ = (uint)bVar2 * auVar14._8_4_ | (uint)!bVar2 * auVar19._8_4_;
    bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
    auVar15._12_4_ = (uint)bVar2 * auVar14._12_4_ | (uint)!bVar2 * auVar19._12_4_;
    bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
    auVar15._16_4_ = (uint)bVar2 * auVar14._16_4_ | (uint)!bVar2 * auVar19._16_4_;
    bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
    auVar15._20_4_ = (uint)bVar2 * auVar14._20_4_ | (uint)!bVar2 * auVar19._20_4_;
    bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
    auVar15._24_4_ = (uint)bVar2 * auVar14._24_4_ | (uint)!bVar2 * auVar19._24_4_;
    bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
    auVar15._28_4_ = (uint)bVar2 * auVar14._28_4_ | (uint)!bVar2 * auVar19._28_4_;
    auVar15._32_4_ = (uint)(bVar7 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar19._32_4_;
    bVar2 = (bool)(bVar7 >> 1 & 1);
    auVar15._36_4_ = (uint)bVar2 * auVar14._36_4_ | (uint)!bVar2 * auVar19._36_4_;
    bVar2 = (bool)(bVar7 >> 2 & 1);
    auVar15._40_4_ = (uint)bVar2 * auVar14._40_4_ | (uint)!bVar2 * auVar19._40_4_;
    bVar2 = (bool)(bVar7 >> 3 & 1);
    auVar15._44_4_ = (uint)bVar2 * auVar14._44_4_ | (uint)!bVar2 * auVar19._44_4_;
    bVar2 = (bool)(bVar7 >> 4 & 1);
    auVar15._48_4_ = (uint)bVar2 * auVar14._48_4_ | (uint)!bVar2 * auVar19._48_4_;
    bVar2 = (bool)(bVar7 >> 5 & 1);
    auVar15._52_4_ = (uint)bVar2 * auVar14._52_4_ | (uint)!bVar2 * auVar19._52_4_;
    bVar2 = (bool)(bVar7 >> 6 & 1);
    auVar15._56_4_ = (uint)bVar2 * auVar14._56_4_ | (uint)!bVar2 * auVar19._56_4_;
    auVar15._60_4_ =
         (uint)(bVar7 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar19._60_4_;
    auVar13 = vextracti64x4_avx512f(auVar15,1);
    auVar14 = vpmulld_avx512f(auVar15,ZEXT3264(auVar13));
    auVar3 = vpmulld_avx(auVar14._0_16_,auVar14._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    auVar4 = vpshufd_avx(auVar3,0x55);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    iVar21 = auVar3._0_4_;
  }
  uVar10 = iVar21 * (val->d).bd;
  if (uVar10 != 0) {
    pfVar1 = val->v;
    lVar11 = 0;
    do {
      dVar20 = std::
               generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                         (rndeng);
      *(uint *)((long)pfVar1 + lVar11) = (uint)(dVar20 < (double)p) * (int)scale;
      lVar11 = lVar11 + 4;
    } while ((ulong)uVar10 << 2 != lVar11);
  }
  return;
}

Assistant:

void TensorTools::RandomBernoulli(Tensor& val, real p, real scale) {
  bernoulli_distribution distribution(p);
  auto b = [&] {return distribution(*rndeng) * scale;};
  generate(val.v, val.v + val.d.size(), b);
}